

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
::
remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
          (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
           *this,node_type type,byte *args,basic_art_key<unsigned_long> *args_1,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *args_2,
          basic_node_ptr<unodb::detail::node_header> **args_3)

{
  _Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true> _Var1;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar2;
  basic_node_ptr<unodb::detail::node_header> **args_local_3;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *args_local_2;
  basic_art_key<unsigned_long> *args_local_1;
  byte *args_local;
  node_type type_local;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  undefined1 local_10;
  
  switch(type) {
  case LEAF:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x37e,"remove_or_choose_subtree");
  case I4:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)
                      this,args,args_1,args_2,args_3);
    local_10 = _Var1._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
               ._M_engaged;
    break;
  case I16:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)
                      this,args,args_1,args_2,args_3);
    local_10 = _Var1._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
               ._M_engaged;
    break;
  case I48:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)
                      this,args,args_1,args_2,args_3);
    local_10 = _Var1._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
               ._M_engaged;
    break;
  case I256:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)
                      this,args,args_1,args_2,args_3);
    local_10 = _Var1._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
               ._M_engaged;
    break;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x380,"remove_or_choose_subtree");
  }
  this_local = _Var1._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
               ._M_payload;
  oVar2.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._9_7_ =
       _Var1._M_payload.
       super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
       _9_7_;
  oVar2.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_engaged = (bool)local_10;
  oVar2.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload._M_value = (basic_node_ptr<unodb::detail::node_header> *)this_local;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar2.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

[[nodiscard]] ReturnType remove_or_choose_subtree(node_type type,
                                                    Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }